

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser.c
# Opt level: O1

MPP_RET vp9d_split_init(Vp9CodecContext *vp9_ctx)

{
  void *ptr;
  void *pvVar1;
  
  ptr = mpp_osal_calloc("vp9d_split_init",0x108);
  if (ptr == (void *)0x0) {
    _mpp_log_l(2,(char *)0x0,"vp9 parser malloc fail",(char *)0x0);
  }
  else {
    pvVar1 = mpp_osal_calloc("vp9d_split_init",0x30);
    if (pvVar1 != (void *)0x0) {
      *(void **)((long)ptr + 0x58) = pvVar1;
      vp9_ctx->priv_data2 = ptr;
      return MPP_OK;
    }
    _mpp_log_l(2,(char *)0x0,"vp9 parser context malloc fail",(char *)0x0);
    mpp_osal_free("vp9d_split_init",ptr);
  }
  return MPP_ERR_NOMEM;
}

Assistant:

MPP_RET vp9d_split_init(Vp9CodecContext *vp9_ctx)
{
    SplitContext_t *ps;
    VP9ParseContext *sc;

    ps = (SplitContext_t *)mpp_calloc(SplitContext_t, 1);
    if (!ps) {
        mpp_err("vp9 parser malloc fail");
        return MPP_ERR_NOMEM;
    }

    sc = (VP9ParseContext *)mpp_calloc(VP9ParseContext, 1);
    if (!sc) {
        mpp_err("vp9 parser context malloc fail");
        mpp_free(ps);
        return MPP_ERR_NOMEM;
    }

    ps->priv_data = (void*)sc;
    vp9_ctx->priv_data2 = (void*)ps;

    return MPP_OK;
}